

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O0

void __thiscall gdsNODE::reset(gdsNODE *this)

{
  gdsNODE *this_local;
  
  this->plex = 0;
  this->layer = 0;
  this->nodetype = 0;
  std::vector<int,_std::allocator<int>_>::clear(&this->xCor);
  std::vector<int,_std::allocator<int>_>::clear(&this->yCor);
  this->propattr = 0;
  std::__cxx11::string::operator=((string *)&this->propvalue,"");
  return;
}

Assistant:

void gdsNODE::reset()
{
  plex = 0; // optional
  layer = 0;
  nodetype = 0;
  // A maximum of 50 coordinates
  xCor.clear();
  yCor.clear();
  propattr = 0;
  propvalue = "\0";
}